

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *this_00;
  string_view sVar3;
  EpsCopyOutputStream stream;
  ulong local_60;
  EpsCopyOutputStream local_58;
  
  iVar2 = (*this->_vptr_MessageLite[3])();
  local_60 = CONCAT44(extraout_var,iVar2);
  if ((local_60 & 0xffffffff80000000) == 0) {
    local_58.is_serialization_deterministic_ =
         (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    local_58.end_ = local_58.buffer_;
    local_58.had_error_ = false;
    local_58.aliasing_enabled_ = false;
    local_58.skip_check_consistency = false;
    local_58.buffer_end_ = local_58.end_;
    local_58.stream_ = output;
    iVar2 = (*this->_vptr_MessageLite[5])(this,local_58.end_,&local_58);
    io::EpsCopyOutputStream::Trim(&local_58,(uint8_t *)CONCAT44(extraout_var_00,iVar2));
    bVar1 = local_58.had_error_ ^ 1;
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x220);
    sVar3 = GetTypeName(this);
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)&local_58,sVar3);
    sVar3._M_str = " exceeded maximum protobuf size of 2GB: ";
    sVar3._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,sVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_long,_0>(this_00,&local_60);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_58);
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8_t* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}